

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O0

void blockchain_tests::CheckGetPruneHeight(BlockManager *blockman,CChain *chain,int height)

{
  bool bVar1;
  int *piVar2;
  long in_FS_OFFSET;
  CBlockIndex *it;
  optional<int> prune_height;
  char *in_stack_fffffffffffffe88;
  lazy_ostream *in_stack_fffffffffffffe90;
  assertion_result *in_stack_fffffffffffffe98;
  CChain *in_stack_fffffffffffffea0;
  const_string *in_stack_fffffffffffffeb0;
  const_string *msg;
  BlockManager *in_stack_fffffffffffffeb8;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffec0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffec8;
  char *this;
  CBlockIndex *local_f8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [32];
  const_string local_b0;
  undefined1 local_a0 [16];
  const_string local_90 [2];
  undefined1 local_14 [20];
  
  local_14._12_8_ = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,
             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x429e5e);
  local_f8 = CChain::operator[](in_stack_fffffffffffffea0,
                                (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  while( true ) {
    bVar1 = false;
    if (local_f8 != (CBlockIndex *)0x0) {
      bVar1 = 0 < local_f8->nHeight;
    }
    if (!bVar1) break;
    local_f8->nStatus = local_f8->nStatus & 0xfffffff7;
    local_f8 = local_f8->pprev;
  }
  local_14._4_8_ = GetPruneHeight(in_stack_fffffffffffffeb8,(CChain *)in_stack_fffffffffffffeb0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8
               ,in_stack_fffffffffffffeb0);
    std::optional<int>::has_value((optional<int> *)in_stack_fffffffffffffe88);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffe98,SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffe90,(basic_cstring<const_char> *)in_stack_fffffffffffffe88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xffffffffffffffb0,(lazy_ostream *)&stack0xffffffffffffff90
               ,local_90,0x5e,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffe88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
    ;
    line_num = local_a0;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    file = &local_b0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe90,(char (*) [1])in_stack_fffffffffffffe88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    piVar2 = std::optional<int>::operator*((optional<int> *)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe98 = (assertion_result *)0x1d26d6a;
    in_stack_fffffffffffffe90 = (lazy_ostream *)local_14;
    in_stack_fffffffffffffe88 = "*prune_height";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_d0,local_e0,0x5f,1,2,piVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_14._12_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);

    // Emulate pruning all blocks from `height` down to the genesis block
    // by unsetting the `BLOCK_HAVE_DATA` flag from `nStatus`
    for (CBlockIndex* it{chain[height]}; it != nullptr && it->nHeight > 0; it = it->pprev) {
        it->nStatus &= ~BLOCK_HAVE_DATA;
    }

    const auto prune_height{GetPruneHeight(blockman, chain)};
    BOOST_REQUIRE(prune_height.has_value());
    BOOST_CHECK_EQUAL(*prune_height, height);
}